

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O2

int __thiscall
hbm::streaming::StreamClient::processStreamMetaInformation
          (StreamClient *this,string *method,Value *params)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  ostream *poVar5;
  Value *pVVar6;
  Value *pVVar7;
  const_iterator cVar8;
  string local_78;
  string *local_58;
  string *local_50;
  string *local_48;
  ValueIteratorBase local_40;
  
  bVar2 = std::operator==(method,"init");
  local_58 = method;
  if (bVar2) {
    pVVar4 = Json::Value::operator[](params,"streamId");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar4);
    std::__cxx11::string::operator=((string *)&this->m_streamId,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    psVar1 = &this->m_address;
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
    poVar5 = std::operator<<(poVar5,": this is ");
    poVar5 = std::operator<<(poVar5,(string *)&this->m_streamId);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
    poVar5 = std::operator<<(poVar5,": supported features: ");
    pVVar4 = Json::Value::operator[](params,"supported");
    poVar5 = Json::operator<<(poVar5,pVVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    pVVar4 = Json::Value::operator[](params,"commandInterfaces");
    cVar8 = Json::Value::begin(pVVar4);
    local_40.current_ = cVar8.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar8.super_ValueIteratorBase.isNull_;
    local_48 = (string *)&this->m_httpPath;
    local_50 = (string *)&this->m_controlPort;
    while( true ) {
      cVar8 = Json::Value::end(pVVar4);
      local_78._M_dataplus._M_p = (pointer)cVar8.super_ValueIteratorBase.current_._M_node;
      local_78._M_string_length._0_1_ = cVar8.super_ValueIteratorBase.isNull_;
      bVar2 = Json::ValueIteratorBase::operator!=(&local_40,(SelfType *)&local_78);
      if (!bVar2) break;
      pVVar6 = Json::ValueIteratorBase::deref(&local_40);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
      poVar5 = std::operator<<(poVar5,": command interfaces: ");
      poVar5 = Json::operator<<(poVar5,pVVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
      pVVar7 = Json::Value::operator[](pVVar6,"httpMethod");
      Json::Value::asString_abi_cxx11_(&local_78,pVVar7);
      iVar3 = strncasecmp(local_78._M_dataplus._M_p,"post",5);
      std::__cxx11::string::~string((string *)&local_78);
      if (iVar3 == 0) {
        pVVar7 = Json::Value::operator[](pVVar6,"httpPath");
        Json::Value::asString_abi_cxx11_(&local_78,pVVar7);
        std::__cxx11::string::operator=(local_48,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      if ((this->m_controlPort)._M_string_length == 0) {
        pVVar6 = Json::Value::operator[](pVVar6,"port");
        Json::Value::asString_abi_cxx11_(&local_78,pVVar6);
        std::__cxx11::string::operator=(local_50,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      Json::ValueIteratorBase::increment(&local_40);
    }
  }
  else {
    bVar2 = std::operator==(method,"time");
    if (bVar2) {
      pVVar4 = Json::Value::operator[](params,"stamp");
      timeInfo::set(&this->m_initialTime,pVVar4);
      pVVar4 = Json::Value::operator[](params,"epoch");
      Json::Value::asString_abi_cxx11_(&local_78,pVVar4);
      std::__cxx11::string::operator=((string *)&this->m_initialTimeEpoch,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pVVar4 = Json::Value::operator[](params,"scale");
      Json::Value::asString_abi_cxx11_(&local_78,pVVar4);
      std::__cxx11::string::operator=((string *)&this->m_initialTimeScale,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  if ((this->m_streamMetaCb).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
    ::operator()(&this->m_streamMetaCb,this,local_58,params);
  }
  return 0;
}

Assistant:

int StreamClient::processStreamMetaInformation(const std::string& method, const Json::Value& params)
		{
			try {
				// stream related meta information
				if (method == "init") {
					// this gives important information needed to control the daq stream.
					m_streamId = params["streamId"].asString();
					std::cout << m_address << ": this is " << m_streamId << std::endl;
					std::cout << m_address << ": supported features: " << params["supported"] << std::endl;
					const Json::Value& commandInterfaces = params["commandInterfaces"];
					for (Json::ValueConstIterator iter = commandInterfaces.begin(); iter!= commandInterfaces.end(); ++iter) {
						const Json::Value& element = *iter;
						std::cout << m_address << ": command interfaces: " << element << std::endl;
						static const char POST[] = "post";
						if (strncasecmp(element["httpMethod"].asString().c_str(), POST, sizeof(POST)) == 0) {
							m_httpPath = element["httpPath"].asString();
						}
						
						// do not overwrite if control port is already set.
						// important for devices behind NAT router
						if (m_controlPort.empty()) {
							m_controlPort = element["port"].asString();
						}
					}
				} else if (method == "time") {
					m_initialTime.set(params["stamp"]);
					m_initialTimeEpoch = params["epoch"].asString();
					m_initialTimeScale = params["scale"].asString();
				}
				if(m_streamMetaCb) {
					m_streamMetaCb(*this, method, params);
				}

				return 0;
			} catch(const std::runtime_error& e) {
				std::cerr << e.what();
				return -1;
			}
		}